

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O3

ion_status_t flat_file_delete(ion_flat_file_t *flat_file,ion_key_t key)

{
  byte bVar1;
  ion_status_t iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ion_fpos_t loc;
  ion_flat_file_row_t row;
  ion_flat_file_row_t last_row;
  ulong local_88;
  ion_key_t local_80;
  ion_flat_file_row_t local_78;
  ion_flat_file_row_t local_60;
  ion_flat_file_row_t local_48;
  
  iVar2.error = '\x14';
  iVar2._1_3_ = 0;
  iVar2.count = 0;
  if (flat_file->sorted_mode != '\0') {
    return iVar2;
  }
  local_88 = 0xffffffffffffffff;
  bVar1 = flat_file_scan(flat_file,-1,(ion_fpos_t *)&local_88,&local_60,'\x01',
                         flat_file_predicate_key_match,key);
  if (bVar1 == 0) {
    uVar6 = 0;
    local_80 = key;
    do {
      uVar5 = local_88;
      lVar4 = flat_file->eof_position - flat_file->row_size;
      uVar7 = (ulong)(lVar4 - flat_file->start_of_data) / flat_file->row_size;
      if (uVar7 != local_88) {
        bVar1 = flat_file_read_row(flat_file,uVar7,&local_48);
        uVar3 = (uint)bVar1;
        if (bVar1 == 0) {
          bVar1 = flat_file_write_row(flat_file,uVar5,&local_48);
          uVar3 = (uint)bVar1;
          if (bVar1 == 0) goto LAB_0010aa4c;
        }
LAB_0010aaba:
        uVar5 = (ulong)uVar3;
        goto LAB_0010aabc;
      }
LAB_0010aa4c:
      local_78.row_status = '\0';
      local_78._1_7_ = 0;
      local_78.key = (ion_key_t)0x0;
      local_78.value = (ion_value_t)0x0;
      bVar1 = flat_file_write_row(flat_file,uVar7,&local_78);
      uVar3 = (uint)bVar1;
      if (bVar1 != 0) goto LAB_0010aaba;
      flat_file->eof_position = lVar4;
      uVar6 = uVar6 + 1;
      bVar1 = flat_file_scan(flat_file,uVar5,(ion_fpos_t *)&local_88,&local_60,'\x01',
                             flat_file_predicate_key_match,local_80);
    } while (bVar1 == 0);
  }
  else {
    uVar6 = 0;
  }
  uVar3 = 0;
  if (bVar1 != 0xe) {
    uVar3 = (uint)bVar1;
  }
  uVar7 = 1;
  if (uVar6 != 0) {
    uVar7 = (ulong)uVar3;
  }
  uVar5 = (ulong)uVar3;
  if (local_88 == 0xffffffffffffffff) {
    uVar5 = uVar7;
  }
  if (bVar1 == 0xe) {
    uVar5 = uVar7;
  }
LAB_0010aabc:
  return (ion_status_t)(uVar5 | (ulong)uVar6 << 0x20);
}

Assistant:

ion_status_t
flat_file_delete(
	ion_flat_file_t *flat_file,
	ion_key_t		key
) {
	if (flat_file->sorted_mode) {
		return ION_STATUS_ERROR(err_sorted_order_violation);
	}

	ion_status_t		status	= ION_STATUS_INITIALIZE;
	ion_flat_file_row_t row;
	ion_err_t			err;
	ion_fpos_t			loc		= -1;

	while (err_ok == (err = flat_file_scan(flat_file, loc, &loc, &row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_key_match, key))) {
		ion_fpos_t			last_record_offset	= flat_file->eof_position - flat_file->row_size;
		ion_flat_file_row_t last_row;
		ion_fpos_t			last_record_index	= (last_record_offset - flat_file->start_of_data) / flat_file->row_size;
		ion_err_t			row_err;

		/* If the last index and the loc are the same, then we can just move the eof position. Saves a read/write. */
		if (last_record_index != loc) {
			row_err = flat_file_read_row(flat_file, last_record_index, &last_row);

			if (err_ok != row_err) {
				status.error = row_err;
				return status;
			}

			row_err = flat_file_write_row(flat_file, loc, &last_row);

			if (err_ok != row_err) {
				status.error = row_err;
				return status;
			}
		}

		/* Set last row to be empty just for sanity reasons. */
		row_err = flat_file_write_row(flat_file, last_record_index, &(ion_flat_file_row_t) { ION_FLAT_FILE_STATUS_EMPTY, NULL, NULL });

		if (err_ok != row_err) {
			status.error = row_err;
			return status;
		}

		/* Soft truncate the file by bumping the eof position back to cut off the last record. */
		flat_file->eof_position = last_record_offset;
		status.count++;

		/* No location movement is done here, since we need to check the row we just swapped in to see if it is
		   also a match. */
	}

	status.error = err_ok;

	if (((err == err_file_hit_eof) || (-1 == loc)) && (status.count == 0)) {
		status.error = err_item_not_found;
	}
	else if (err != err_file_hit_eof) {
		status.error = err;
	}

	return status;
}